

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatwindow.cpp
# Opt level: O3

void __thiscall ChatWindow::loginFailed(ChatWindow *this,QString *reason)

{
  QArrayData *local_30 [3];
  
  QMetaObject::tr((char *)local_30,(char *)&staticMetaObject,0x10a7f3);
  QMessageBox::critical(this,local_30,reason,0x400,0);
  if (local_30[0] != (QArrayData *)0x0) {
    LOCK();
    (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30[0],2,8);
    }
  }
  connectedToServer(this);
  return;
}

Assistant:

void ChatWindow::loginFailed(const QString &reason)
{
    // the server rejected the login attempt
    // display the reason for the rejection in a message box
    QMessageBox::critical(this, tr("Error"), reason);
    // allow the user to retry, execute the same slot as when just connected
    connectedToServer();
}